

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic_test.cpp
# Opt level: O3

void __thiscall
Dinic_BenchmarkChainV1000E10000_Test::~Dinic_BenchmarkChainV1000E10000_Test
          (Dinic_BenchmarkChainV1000E10000_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Dinic, BenchmarkChainV1000E10000) {
    srand(1);
    int n = 1000;
    int m = 10000;
    int range = 1000;
    int perEdge = m / n; // yes, it's not exact
    Dinic d(n);
    rep(i, 0, n - 1) {
        rep(j, 0, perEdge) {
            d.addEdge(i, i + 1, range + rand() % range);
        }
    }
    ll flow = d.getFlow(0, n - 1);
    EXPECT_EQ(12375, flow);
}